

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::String::Repeat(String *this,int count)

{
  int iVar1;
  int count_local;
  String *this_local;
  
  iVar1 = (this->super_tagbstring).slen * count;
  if (iVar1 < 1) {
    Truncate(this,0);
  }
  else {
    iVar1 = bpattern(&this->super_tagbstring,iVar1);
    if (iVar1 == -1) {
      fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
              "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
              ,0x544,"Failure in repeat");
    }
  }
  return;
}

Assistant:

void String::Repeat(int count)
    {
        count *= slen;
        if (count <= 0)
        {
            Truncate(0);
            return;
        }
        if (BSTR_ERR == bpattern(this, count))    bstringThrow("Failure in repeat");
    }